

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ieee.cc
# Opt level: O2

void TestNextDouble(void)

{
  uint64_t d64;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  undefined4 extraout_EDX;
  uint uVar1;
  double dVar2;
  undefined1 auVar3 [16];
  Double d0;
  Double d2;
  Double d1;
  Double local_58;
  double local_50;
  Double local_48;
  Double local_40;
  Double local_38;
  undefined8 extraout_XMM0_Qb;
  
  local_58.d64_ = 0;
  dVar2 = double_conversion::Double::NextDouble(&local_58);
  CheckEqualsHelper((char *)0x19c,0xc1d229,"Double(0.0).NextDouble()",4.94065645841247e-324,
                    (char *)CONCAT71(in_register_00000009,in_CL),dVar2);
  local_58.d64_ = 0x8000000000000000;
  dVar2 = double_conversion::Double::NextDouble(&local_58);
  CheckEqualsHelper((char *)0x19d,0xc0f3ff,"Double(-0.0).NextDouble()",0.0,
                    (char *)CONCAT71(in_register_00000009,in_CL),dVar2);
  local_58.d64_ = 0x8000000000000001;
  dVar2 = double_conversion::Double::NextDouble(&local_58);
  CheckEqualsHelper((char *)0x19e,0xc0f3fe,"Double(-4e-324).NextDouble()",-0.0,
                    (char *)CONCAT71(in_register_00000009,in_CL),dVar2);
  local_58.d64_ = 0x8000000000000000;
  dVar2 = double_conversion::Double::NextDouble(&local_58);
  CheckHelper((char *)0x19f,0xc1d08f,(char *)(ulong)(-1 < (long)dVar2),(bool)in_CL);
  local_58.d64_ = 0x8000000000000001;
  auVar3._0_8_ = double_conversion::Double::NextDouble(&local_58);
  auVar3._8_8_ = extraout_XMM0_Qb;
  uVar1 = movmskpd(extraout_EDX,auVar3);
  CheckHelper((char *)0x1a0,0xc1d0bc,(char *)(ulong)(uVar1 & 1),(bool)in_CL);
  local_58.d64_ = 0x8000000000000001;
  local_38.d64_ = (uint64_t)double_conversion::Double::NextDouble(&local_58);
  local_50 = double_conversion::Double::NextDouble(&local_38);
  local_40.d64_ = (uint64_t)local_50;
  CheckEqualsHelper((char *)0x1a4,0xc0f3fe,"d1.value()",-0.0,
                    (char *)CONCAT71(in_register_00000009,in_CL),(double)local_38.d64_);
  CheckHelper((char *)0x1a5,0xc1d0f7,(char *)(local_38.d64_ >> 0x3f),(bool)in_CL);
  CheckEqualsHelper((char *)0x1a6,0xc0f3ff,"d2.value()",0.0,
                    (char *)CONCAT71(in_register_00000009,in_CL),local_50);
  CheckHelper((char *)0x1a7,0xc1d110,(char *)(ulong)(-1 < (long)local_50),(bool)in_CL);
  dVar2 = double_conversion::Double::NextDouble(&local_40);
  CheckEqualsHelper((char *)0x1a8,0xc1d229,"d2.NextDouble()",4.94065645841247e-324,
                    (char *)CONCAT71(in_register_00000009,in_CL),dVar2);
  local_48.d64_ = 0xfff0000000000000;
  dVar2 = double_conversion::Double::NextDouble(&local_48);
  CheckEqualsHelper((char *)0x1a9,0xc1d12e,"Double(-Double::Infinity()).NextDouble()",
                    -1.79769313486232e+308,(char *)CONCAT71(in_register_00000009,in_CL),dVar2);
  local_48.d64_ = 0x7fefffffffffffff;
  dVar2 = double_conversion::Double::NextDouble(&local_48);
  CheckEqualsHelper((char *)0x1ab,0xc198e2,
                    "Double(DOUBLE_CONVERSION_UINT64_2PART_C(0x7fefffff, ffffffff)).NextDouble()",
                    INFINITY,(char *)CONCAT71(in_register_00000009,in_CL),dVar2);
  return;
}

Assistant:

TEST(NextDouble) {
  CHECK_EQ(4e-324, Double(0.0).NextDouble());
  CHECK_EQ(0.0, Double(-0.0).NextDouble());
  CHECK_EQ(-0.0, Double(-4e-324).NextDouble());
  CHECK(Double(Double(-0.0).NextDouble()).Sign() > 0);
  CHECK(Double(Double(-4e-324).NextDouble()).Sign() < 0);
  Double d0(-4e-324);
  Double d1(d0.NextDouble());
  Double d2(d1.NextDouble());
  CHECK_EQ(-0.0, d1.value());
  CHECK(d1.Sign() < 0);
  CHECK_EQ(0.0, d2.value());
  CHECK(d2.Sign() > 0);
  CHECK_EQ(4e-324, d2.NextDouble());
  CHECK_EQ(-1.7976931348623157e308, Double(-Double::Infinity()).NextDouble());
  CHECK_EQ(Double::Infinity(),
           Double(DOUBLE_CONVERSION_UINT64_2PART_C(0x7fefffff, ffffffff)).NextDouble());
}